

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O2

void __thiscall
chrono::ChValueSpecific<float>::CallOut(ChValueSpecific<float> *this,ChArchiveOut *marchive)

{
  (*(marchive->super_ChArchive)._vptr_ChArchive[5])(marchive);
  return;
}

Assistant:

void ChValueSpecific<TClass>::CallOut(ChArchiveOut& marchive) {
          marchive.out(CHNVP(*this->_ptr_to_val,this->_name.c_str()));
}